

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_state_auth_cram_resp(connectdata *conn,int smtpcode,smtpstate instate)

{
  size_t local_50;
  size_t len;
  char *rplyb64;
  char *chlg64;
  char *chlg;
  SessionHandle *data;
  smtpstate local_20;
  CURLcode result;
  smtpstate instate_local;
  int smtpcode_local;
  connectdata *conn_local;
  
  data._4_4_ = 0;
  chlg = (char *)conn->data;
  chlg64 = (char *)0x0;
  rplyb64 = (char *)0x0;
  len = 0;
  local_50 = 0;
  local_20 = instate;
  result = smtpcode;
  _instate_local = conn;
  if (smtpcode == 0x14e) {
    smtp_get_message((((SessionHandle *)chlg)->state).buffer,&rplyb64);
    data._4_4_ = Curl_sasl_decode_cram_md5_message(rplyb64,&chlg64,&local_50);
    if (data._4_4_ == CURLE_OK) {
      data._4_4_ = Curl_sasl_create_cram_md5_message
                             ((SessionHandle *)chlg,chlg64,_instate_local->user,
                              _instate_local->passwd,(char **)&len,&local_50);
      if (((data._4_4_ == CURLE_OK) && (len != 0)) &&
         (data._4_4_ = Curl_pp_sendf(&(_instate_local->proto).ftpc.pp,"%s",len),
         data._4_4_ == CURLE_OK)) {
        state(_instate_local,SMTP_AUTH_FINAL);
      }
    }
    else {
      data._4_4_ = Curl_pp_sendf(&(_instate_local->proto).ftpc.pp,"%s","*");
      if (data._4_4_ == CURLE_OK) {
        state(_instate_local,SMTP_AUTH_CANCEL);
      }
    }
    if (chlg64 != (char *)0x0) {
      (*Curl_cfree)(chlg64);
      chlg64 = (char *)0x0;
    }
    if (len != 0) {
      (*Curl_cfree)((void *)len);
    }
    conn_local._4_4_ = data._4_4_;
  }
  else {
    Curl_failf((SessionHandle *)chlg,"Access denied: %d",(ulong)(uint)smtpcode);
    conn_local._4_4_ = CURLE_LOGIN_DENIED;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode smtp_state_auth_cram_resp(struct connectdata *conn,
                                          int smtpcode,
                                          smtpstate instate)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  char *chlg = NULL;
  char *chlg64 = NULL;
  char *rplyb64 = NULL;
  size_t len = 0;

  (void)instate; /* no use for this yet */

  if(smtpcode != 334) {
    failf(data, "Access denied: %d", smtpcode);
    return CURLE_LOGIN_DENIED;
  }

  /* Get the challenge message */
  smtp_get_message(data->state.buffer, &chlg64);

  /* Decode the challenge message */
  result = Curl_sasl_decode_cram_md5_message(chlg64, &chlg, &len);
  if(result) {
    /* Send the cancellation */
    result = Curl_pp_sendf(&conn->proto.smtpc.pp, "%s", "*");

    if(!result)
      state(conn, SMTP_AUTH_CANCEL);
  }
  else {
    /* Create the response message */
    result = Curl_sasl_create_cram_md5_message(data, chlg, conn->user,
                                               conn->passwd, &rplyb64, &len);
    if(!result && rplyb64) {
      /* Send the response */
      result = Curl_pp_sendf(&conn->proto.smtpc.pp, "%s", rplyb64);

      if(!result)
        state(conn, SMTP_AUTH_FINAL);
    }
  }

  Curl_safefree(chlg);
  Curl_safefree(rplyb64);

  return result;
}